

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
::
nosize_unchecked_emplace_at<std::pair<slang::ast::Symbol_const*&&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::ast::Symbol_*&&,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_&&>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  TempVarSymbol **ppTVar3;
  bitmask<slang::ast::ASTFlags> *pbVar4;
  ulong uVar5;
  group_type_pointer pgVar6;
  value_type_pointer ppVar7;
  tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *ptVar8;
  uint uVar9;
  ushort uVar10;
  byte bVar11;
  not_null<const_slang::ast::Scope_*> nVar12;
  underlying_type uVar13;
  Symbol *pSVar14;
  RandomizeDetails *pRVar15;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var16;
  SymbolIndex SVar17;
  undefined4 uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  
  uVar5 = arrays_->groups_size_mask;
  pgVar6 = arrays_->groups_;
  lVar19 = 1;
  while( true ) {
    pgVar1 = pgVar6 + pos0;
    pgVar2 = pgVar6 + pos0;
    bVar11 = pgVar2->m[0xf].n;
    auVar20[0] = -(pgVar2->m[0].n == '\0');
    auVar20[1] = -(pgVar2->m[1].n == '\0');
    auVar20[2] = -(pgVar2->m[2].n == '\0');
    auVar20[3] = -(pgVar2->m[3].n == '\0');
    auVar20[4] = -(pgVar2->m[4].n == '\0');
    auVar20[5] = -(pgVar2->m[5].n == '\0');
    auVar20[6] = -(pgVar2->m[6].n == '\0');
    auVar20[7] = -(pgVar2->m[7].n == '\0');
    auVar20[8] = -(pgVar2->m[8].n == '\0');
    auVar20[9] = -(pgVar2->m[9].n == '\0');
    auVar20[10] = -(pgVar2->m[10].n == '\0');
    auVar20[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar20[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar20[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar20[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar20[0xf] = -(bVar11 == 0);
    uVar10 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe;
    if (uVar10 != 0) break;
    pgVar1->m[0xf].n = bVar11 | '\x01' << ((byte)hash & 7);
    pos0 = pos0 + lVar19 & uVar5;
    lVar19 = lVar19 + 1;
  }
  uVar9 = 0;
  if (uVar10 != 0) {
    for (; (uVar10 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
    }
  }
  ppVar7 = arrays_->elements_;
  ppVar7[pos0 * 0xf + (ulong)uVar9].first = *args->first;
  ptVar8 = args->second;
  ppVar7[pos0 * 0xf + (ulong)uVar9].second.
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
       (ptVar8->
       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
       super__Tuple_impl<1UL,_slang::ast::ASTContext>.
       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
  nVar12.ptr = (ptVar8->
               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
               ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
  SVar17 = (ptVar8->
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
  uVar18 = *(undefined4 *)
            &(ptVar8->
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
  uVar13 = (ptVar8->
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
  pSVar14 = (ptVar8->
            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
            ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
  pRVar15 = (ptVar8->
            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
            ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
  ppTVar3 = &ppVar7[pos0 * 0xf + (ulong)uVar9].second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
  *ppTVar3 = (ptVar8->
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
  ppTVar3[1] = (TempVarSymbol *)pRVar15;
  pbVar4 = &ppVar7[pos0 * 0xf + (ulong)uVar9].second.
            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
            .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags;
  pbVar4->m_bits = uVar13;
  pbVar4[1] = (bitmask<slang::ast::ASTFlags>)pSVar14;
  ppVar7[pos0 * 0xf + (ulong)uVar9].second.
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr = nVar12.ptr;
  p_Var16 = &ppVar7[pos0 * 0xf + (ulong)uVar9].second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
  ;
  (p_Var16->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex = SVar17;
  *(undefined4 *)
   &(p_Var16->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
    super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc = uVar18;
  ppVar7[pos0 * 0xf + (ulong)uVar9].second.
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
       (ptVar8->
       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
       super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl;
  pgVar1->m[uVar9].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg = pgVar1;
  __return_storage_ptr__->n = uVar9;
  __return_storage_ptr__->p = ppVar7 + pos0 * 0xf + (ulong)uVar9;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }